

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O3

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,Binary *binary)

{
  bool bVar1;
  element_type *peVar2;
  
  bVar1 = (binary->super_Expr).is_const_;
  peVar2 = (binary->left_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->is_const_ = bVar1;
  ((binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->is_const_ =
       bVar1;
  (*peVar2->_vptr_Expr[2])(peVar2,this);
  peVar2 = (binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar2->_vptr_Expr[2])(peVar2,this);
  MatchTypes(this,(binary->left_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (binary->right_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr,false
             ,&binary->super_Expr);
  return;
}

Assistant:

void TypeChecker::Visit(Binary& binary) {
  binary.left_->is_const_ = binary.is_const_;
  binary.right_->is_const_ = binary.is_const_;
  binary.left_->Accept(*this);
  binary.right_->Accept(*this);
  MatchTypes(binary.left_.get(), binary.right_.get(), false, &binary);
}